

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

string * ghc::filesystem::detail::systemErrorText<int>(string *__return_storage_ptr__,int code)

{
  int *piVar1;
  char *pcVar2;
  char buffer [512];
  allocator local_209;
  char local_208 [512];
  
  if (code == 0) {
    piVar1 = __errno_location();
    code = *piVar1;
  }
  pcVar2 = strerror_r(code,local_208,0x200);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_209);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE std::string systemErrorText(ErrorNumber code = 0)
{
#if defined(GHC_OS_WINDOWS)
    LPVOID msgBuf;
    DWORD dw = code ? static_cast<DWORD>(code) : ::GetLastError();
    FormatMessageW(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS, NULL, dw, MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT), (LPWSTR)&msgBuf, 0, NULL);
    std::string msg = toUtf8(std::wstring((LPWSTR)msgBuf));
    LocalFree(msgBuf);
    return msg;
#else
    char buffer[512];
    return strerror_adapter(strerror_r(code ? code : errno, buffer, sizeof(buffer)), buffer);
#endif
}